

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddSymbol
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *name,
          FileDescriptorProto *value)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  bool bVar3;
  iterator iVar4;
  LogMessage *pLVar5;
  const_iterator __position;
  _Alloc_node __an;
  _Alloc_node local_78;
  undefined1 local_70 [32];
  FileDescriptorProto *local_50;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>
  *local_38;
  
  bVar3 = ValidateSymbolName(this,name);
  if (bVar3) {
    iVar4 = FindLastLessOrEqual(this,name);
    p_Var1 = &(this->by_symbol_)._M_t._M_impl.super__Rb_tree_header;
    local_50 = value;
    if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
      pcVar2 = (name->_M_dataplus)._M_p;
      local_70._0_8_ = local_70 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,pcVar2,pcVar2 + name->_M_string_length);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>
      ::
      _M_insert_unique<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>
                  *)&this->by_symbol_,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>
                  *)local_70);
      if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
LAB_0019f238:
        operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
      }
    }
    else {
      local_38 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>
                  *)&this->by_symbol_;
      bVar3 = IsSubSymbol(this,(string *)(iVar4._M_node + 1),name);
      if (bVar3) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_70,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/descriptor_database.cc"
                   ,0x6d);
        pLVar5 = internal::LogMessage::operator<<((LogMessage *)local_70,"Symbol name \"");
        pLVar5 = internal::LogMessage::operator<<(pLVar5,name);
        pLVar5 = internal::LogMessage::operator<<(pLVar5,"\" conflicts with the existing symbol \"")
        ;
        pLVar5 = internal::LogMessage::operator<<(pLVar5,(string *)(iVar4._M_node + 1));
        pLVar5 = internal::LogMessage::operator<<(pLVar5,"\".");
        internal::LogFinisher::operator=((LogFinisher *)&local_78,pLVar5);
        goto LAB_0019f1f1;
      }
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar4._M_node);
      if ((_Rb_tree_header *)__position._M_node != p_Var1) {
        bVar3 = IsSubSymbol(this,name,(string *)(__position._M_node + 1));
        if (bVar3) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_70,LOGLEVEL_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/descriptor_database.cc"
                     ,0x7a);
          pLVar5 = internal::LogMessage::operator<<((LogMessage *)local_70,"Symbol name \"");
          pLVar5 = internal::LogMessage::operator<<(pLVar5,name);
          pLVar5 = internal::LogMessage::operator<<
                             (pLVar5,"\" conflicts with the existing symbol \"");
          pLVar5 = internal::LogMessage::operator<<(pLVar5,(string *)(__position._M_node + 1));
          pLVar5 = internal::LogMessage::operator<<(pLVar5,"\".");
          internal::LogFinisher::operator=((LogFinisher *)&local_78,pLVar5);
          goto LAB_0019f1f1;
        }
      }
      pcVar2 = (name->_M_dataplus)._M_p;
      local_70._0_8_ = local_70 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,pcVar2,pcVar2 + name->_M_string_length);
      local_78._M_t =
           (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>_>
            *)local_38;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>
      ::
      _M_insert_unique_<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>::_Alloc_node>
                (local_38,__position,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>
                  *)local_70,&local_78);
      if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) goto LAB_0019f238;
    }
    bVar3 = true;
  }
  else {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_70,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x5e);
    pLVar5 = internal::LogMessage::operator<<((LogMessage *)local_70,"Invalid symbol name: ");
    pLVar5 = internal::LogMessage::operator<<(pLVar5,name);
    internal::LogFinisher::operator=((LogFinisher *)&local_78,pLVar5);
LAB_0019f1f1:
    internal::LogMessage::~LogMessage((LogMessage *)local_70);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddSymbol(
    const string& name, Value value) {
  // We need to make sure not to violate our map invariant.

  // If the symbol name is invalid it could break our lookup algorithm (which
  // relies on the fact that '.' sorts before all other characters that are
  // valid in symbol names).
  if (!ValidateSymbolName(name)) {
    GOOGLE_LOG(ERROR) << "Invalid symbol name: " << name;
    return false;
  }

  // Try to look up the symbol to make sure a super-symbol doesn't already
  // exist.
  typename map<string, Value>::iterator iter = FindLastLessOrEqual(name);

  if (iter == by_symbol_.end()) {
    // Apparently the map is currently empty.  Just insert and be done with it.
    by_symbol_.insert(typename map<string, Value>::value_type(name, value));
    return true;
  }

  if (IsSubSymbol(iter->first, name)) {
    GOOGLE_LOG(ERROR) << "Symbol name \"" << name << "\" conflicts with the existing "
                  "symbol \"" << iter->first << "\".";
    return false;
  }

  // OK, that worked.  Now we have to make sure that no symbol in the map is
  // a sub-symbol of the one we are inserting.  The only symbol which could
  // be so is the first symbol that is greater than the new symbol.  Since
  // |iter| points at the last symbol that is less than or equal, we just have
  // to increment it.
  ++iter;

  if (iter != by_symbol_.end() && IsSubSymbol(name, iter->first)) {
    GOOGLE_LOG(ERROR) << "Symbol name \"" << name << "\" conflicts with the existing "
                  "symbol \"" << iter->first << "\".";
    return false;
  }

  // OK, no conflicts.

  // Insert the new symbol using the iterator as a hint, the new entry will
  // appear immediately before the one the iterator is pointing at.
  by_symbol_.insert(iter, typename map<string, Value>::value_type(name, value));

  return true;
}